

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_slist.c
# Opt level: O3

void * ares_slist_node_claim(ares_slist_node_t *node)

{
  size_t *psVar1;
  ares_slist_t *paVar2;
  void *pvVar3;
  
  if (node == (ares_slist_node_t *)0x0) {
    pvVar3 = (void *)0x0;
  }
  else {
    pvVar3 = node->data;
    paVar2 = node->parent;
    ares_slist_node_pop(node);
    ares_free(node->next);
    ares_free(node->prev);
    ares_free(node);
    psVar1 = &paVar2->cnt;
    *psVar1 = *psVar1 - 1;
  }
  return pvVar3;
}

Assistant:

void *ares_slist_node_claim(ares_slist_node_t *node)
{
  ares_slist_t *list;
  void         *val;

  if (node == NULL) {
    return NULL;
  }

  list = node->parent;
  val  = node->data;

  ares_slist_node_pop(node);

  ares_free(node->next);
  ares_free(node->prev);
  ares_free(node);

  list->cnt--;

  return val;
}